

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O2

void __thiscall spdlog::logger::default_err_handler_(logger *this,string *msg)

{
  time_t now;
  tm tm_time;
  char date_buf [100];
  
  now = time((time_t *)0x0);
  if (0x3b < now - (this->last_err_time_).super___atomic_base<long>._M_i) {
    LOCK();
    (this->last_err_time_).super___atomic_base<long>._M_i = now;
    UNLOCK();
    localtime_r(&now,(tm *)&tm_time);
    strftime(date_buf,100,"%Y-%m-%d %H:%M:%S",(tm *)&tm_time);
    fmt::v5::print<char[34],char[100],std::__cxx11::string,std::__cxx11::string>
              (_stderr,(char (*) [34])"[*** LOG ERROR ***] [{}] [{}] {}\n",&date_buf,&this->name_,
               msg);
  }
  return;
}

Assistant:

inline void spdlog::logger::default_err_handler_(const std::string &msg)
{
    auto now = time(nullptr);
    if (now - last_err_time_ < 60)
    {
        return;
    }
    last_err_time_ = now;
    auto tm_time = details::os::localtime(now);
    char date_buf[100];
    std::strftime(date_buf, sizeof(date_buf), "%Y-%m-%d %H:%M:%S", &tm_time);
    fmt::print(stderr, "[*** LOG ERROR ***] [{}] [{}] {}\n", date_buf, name(), msg);
}